

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O0

shared_ptr<const_HawkTracer::parser::EventKlassField> __thiscall
HawkTracer::parser::EventKlass::get_field(EventKlass *this,char *name,bool recursive)

{
  byte in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_HawkTracer::parser::EventKlassField> sVar1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> l;
  bool recursive_local;
  char *name_local;
  EventKlass *this_local;
  
  l._M_device._7_1_ = in_CL & 1;
  std::lock_guard<std::mutex>::lock_guard(&local_30,(mutex_type *)name);
  _get_field(this,name,recursive);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  sVar1.super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_HawkTracer::parser::EventKlassField>)
         sVar1.
         super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const EventKlassField> EventKlass::get_field(const char* name, bool recursive) const
{
    std::lock_guard<std::mutex> l(_fields_mtx);

    return _get_field(name, recursive);
}